

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_socket.c
# Opt level: O0

void oonf_socket_add(oonf_socket_entry *entry)

{
  list_entity **pplVar1;
  list_entity *plVar2;
  oonf_socket_entry *entry_local;
  undefined1 local_3c [8];
  epoll_event event;
  
  if ((log_global_mask[_oonf_socket_subsystem.logging] & 1) != 0) {
    oonf_log(LOG_SEVERITY_DEBUG,_oonf_socket_subsystem.logging,"src/base/oonf_socket.c",0x91,
             (void *)0x0,0,"Adding socket entry %s (%d) to scheduler\n",entry->name,(entry->fd).fd);
  }
  plVar2 = &entry->_node;
  plVar2->next = &_socket_head;
  (entry->_node).prev = _socket_head.prev;
  pplVar1 = &(_socket_head.prev)->next;
  _socket_head.prev = plVar2;
  *pplVar1 = plVar2;
  event.data.ptr = &entry->fd;
  memset(local_3c,0,0xc);
  local_3c._0_4_ = 0;
  stack0xffffffffffffffc8 = event.data;
  epoll_ctl(_socket_events._epoll_fd,1,*event.data.ptr,(epoll_event *)local_3c);
  return;
}

Assistant:

void
oonf_socket_add(struct oonf_socket_entry *entry) {
  OONF_DEBUG(LOG_SOCKET, "Adding socket entry %s (%d) to scheduler\n", entry->name, os_fd_get_fd(&entry->fd));

  list_add_before(&_socket_head, &entry->_node);
  os_fd_event_socket_add(&_socket_events, &entry->fd);
}